

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O1

BlendEquation vkt::pipeline::mapVkBlendOp(VkBlendOp blendOp)

{
  BlendEquation BVar1;
  
  BVar1 = BLENDEQUATION_LAST;
  if (blendOp < VK_BLEND_OP_LAST) {
    BVar1 = blendOp;
  }
  return BVar1;
}

Assistant:

rr::BlendEquation mapVkBlendOp (VkBlendOp blendOp)
{
	switch (blendOp)
	{
		case VK_BLEND_OP_ADD:					return rr::BLENDEQUATION_ADD;
		case VK_BLEND_OP_SUBTRACT:				return rr::BLENDEQUATION_SUBTRACT;
		case VK_BLEND_OP_REVERSE_SUBTRACT:		return rr::BLENDEQUATION_REVERSE_SUBTRACT;
		case VK_BLEND_OP_MIN:					return rr::BLENDEQUATION_MIN;
		case VK_BLEND_OP_MAX:					return rr::BLENDEQUATION_MAX;
		default:
			DE_ASSERT(false);
	}
	return rr::BLENDEQUATION_LAST;
}